

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei
          (BlendMaskStateMachine *this,int idx,GLenum src_rgb,GLenum dst_rgb,GLenum src_a,
          GLenum dst_a)

{
  reference pvVar1;
  GLenum dst_a_local;
  GLenum src_a_local;
  GLenum dst_rgb_local;
  GLenum src_rgb_local;
  int idx_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->blendFuncSeparatei)(idx,src_rgb,dst_rgb,src_a,dst_a);
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->func_src_rgb = src_rgb;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->func_src_a = src_a;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->func_dst_rgb = dst_rgb;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->func_dst_a = dst_a;
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFuncSeparatei(int idx, glw::GLenum src_rgb,
																		  glw::GLenum dst_rgb, glw::GLenum src_a,
																		  glw::GLenum dst_a)
{
	gl.blendFuncSeparatei(idx, src_rgb, dst_rgb, src_a, dst_a);
	state[idx].func_src_rgb = src_rgb;
	state[idx].func_src_a   = src_a;
	state[idx].func_dst_rgb = dst_rgb;
	state[idx].func_dst_a   = dst_a;
}